

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O2

void __thiscall myvk::Semaphore::~Semaphore(Semaphore *this)

{
  ~Semaphore(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Semaphore::~Semaphore() {
	if (m_semaphore)
		vkDestroySemaphore(m_device_ptr->GetHandle(), m_semaphore, nullptr);
}